

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O1

char * phosg::fgets_abi_cxx11_(char *__s,int __n,FILE *__stream)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  string *psVar4;
  int iVar5;
  reference this;
  char *pcVar6;
  size_t __n_00;
  io_error *this_00;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *items;
  undefined4 in_register_00000034;
  FILE *__stream_00;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  blocks;
  char local_b1;
  string *local_b0;
  string local_a8;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  
  __stream_00 = (FILE *)CONCAT44(in_register_00000034,__n);
  local_88.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_b0 = (string *)__s;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map((_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_88,0);
  do {
    local_a8._M_dataplus._M_p._0_4_ = 0x100;
    local_b1 = '\0';
    this = ::std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
           emplace_back<int,char>
                     ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
                      (int *)&local_a8,&local_b1);
    pcVar6 = ::fgets((this->_M_dataplus)._M_p,(int)this->_M_string_length,__stream_00);
    if (pcVar6 == (char *)0x0) {
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back(&local_88);
      iVar5 = feof(__stream_00);
      if (iVar5 == 0) {
        this_00 = (io_error *)__cxa_allocate_exception(0x20);
        iVar5 = fileno(__stream_00);
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"cannot read from stream","");
        io_error::io_error(this_00,iVar5,&local_a8);
        __cxa_throw(this_00,&io_error::typeinfo,io_error::~io_error);
      }
      goto LAB_00117d1d;
    }
    pcVar6 = (this->_M_dataplus)._M_p;
    __n_00 = strlen(pcVar6);
  } while ((0xff < __n_00) && (pcVar6[0xff] != '\n'));
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            (this,__n_00,'\0');
LAB_00117d1d:
  psVar4 = local_b0;
  items = (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)((long)local_88.
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)local_88.
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first >> 5);
  if ((long)items +
      ((((ulong)((long)local_88.
                       super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node -
                (long)local_88.
                      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
      (ulong)(local_88.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 0x10 +
      ((long)local_88.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last -
       (long)local_88.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur >> 5) == 1) {
    (local_b0->_M_dataplus)._M_p = (pointer)&local_b0->field_2;
    pcVar2 = ((local_88.
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur)->_M_dataplus)._M_p;
    paVar1 = &(local_88.
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur)->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 == paVar1) {
      uVar3 = *(undefined8 *)
               ((long)&(local_88.
                        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur)->field_2 + 8);
      (local_b0->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
      *(undefined8 *)((long)&local_b0->field_2 + 8) = uVar3;
    }
    else {
      (local_b0->_M_dataplus)._M_p = pcVar2;
      (local_b0->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    local_b0->_M_string_length =
         (local_88.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur)->_M_string_length;
    ((local_88.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur)->_M_dataplus)._M_p = (pointer)paVar1;
    (local_88.
     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Deque_impl_data._M_start._M_cur)->_M_string_length = 0;
    ((local_88.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur)->field_2)._M_local_buf[0] = '\0';
  }
  else {
    join<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (local_b0,(phosg *)&local_88,items);
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque(&local_88);
  return (char *)psVar4;
}

Assistant:

std::string fgets(FILE* f) {
  deque<std::string> blocks;
  for (;;) {
    std::string& block = blocks.emplace_back(0x100, '\0');
    if (!::fgets(block.data(), block.size(), f)) {
      blocks.pop_back();
      if (::feof(f)) {
        break;
      } else {
        throw io_error(fileno(f), "cannot read from stream");
      }
    }
    size_t block_bytes = strlen(block.c_str());
    if ((block_bytes < 0x100) || (block[0xFF] == '\n')) {
      block.resize(block_bytes);
      break; // The line ends at the end of this block
    }
  }

  if (blocks.size() == 1) {
    return std::move(blocks.front());
  } else {
    return join(blocks);
  }
}